

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_Bool tt_check_trickyness(FT_Face face)

{
  FT_Bool FVar1;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._7_1_ = '\0';
  }
  else {
    if ((face->family_name != (FT_String *)0x0) &&
       (FVar1 = tt_check_trickyness_family(face->family_name), FVar1 != '\0')) {
      return '\x01';
    }
    FVar1 = tt_check_trickyness_sfnt_ids((TT_Face)face);
    if (FVar1 == '\0') {
      face_local._7_1_ = '\0';
    }
    else {
      face_local._7_1_ = '\x01';
    }
  }
  return face_local._7_1_;
}

Assistant:

static FT_Bool
  tt_check_trickyness( FT_Face  face )
  {
    if ( !face )
      return FALSE;

    /* For first, check the face name for quick check. */
    if ( face->family_name                               &&
         tt_check_trickyness_family( face->family_name ) )
    {
      FT_TRACE3(( "found as a tricky font"
                  " by its family name: %s\n", face->family_name ));
      return TRUE;
    }

    /* Type42 fonts may lack `name' tables, we thus try to identify */
    /* tricky fonts by checking the checksums of Type42-persistent  */
    /* sfnt tables (`cvt', `fpgm', and `prep').                     */
    if ( tt_check_trickyness_sfnt_ids( (TT_Face)face ) )
    {
      FT_TRACE3(( "found as a tricky font"
                  " by its cvt/fpgm/prep table checksum\n" ));
      return TRUE;
    }

    return FALSE;
  }